

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UBool __thiscall
icu_63::RuleBasedNumberFormat::operator==(RuleBasedNumberFormat *this,Format *other)

{
  NFRuleSet **ppNVar1;
  long lVar2;
  bool bVar3;
  UBool UVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  if (this == (RuleBasedNumberFormat *)other) {
    return '\x01';
  }
  bVar3 = std::type_info::operator==
                    ((type_info *)
                     (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  if (((bVar3) &&
      (UVar4 = Locale::operator==(&this->locale,(Locale *)(other[1].actualLocale + 0x38)),
      UVar4 != '\0')) && (this->lenient == other[1].field_0x144)) {
    if (this->localizations == (LocalizationInfo *)0x0) {
      uVar6 = (uint)(*(long *)other[2].actualLocale == 0);
    }
    else {
      if (*(long *)other[2].actualLocale == 0) {
        return '\0';
      }
      iVar5 = (*this->localizations->_vptr_LocalizationInfo[2])();
      uVar6 = (uint)(char)iVar5;
    }
    if (uVar6 != 0) {
      ppNVar1 = this->fRuleSets;
      lVar2 = *(long *)(other[1].actualLocale + 0x18);
      if (lVar2 == 0 || ppNVar1 == (NFRuleSet **)0x0) {
        return ppNVar1 == (NFRuleSet **)0x0 && lVar2 == 0;
      }
      for (lVar7 = 0; *(NFRuleSet **)((long)ppNVar1 + lVar7) != (NFRuleSet *)0x0; lVar7 = lVar7 + 8)
      {
        if (*(NFRuleSet **)(lVar2 + lVar7) == (NFRuleSet *)0x0) {
          return '\0';
        }
        UVar4 = NFRuleSet::operator==
                          (*(NFRuleSet **)((long)ppNVar1 + lVar7),*(NFRuleSet **)(lVar2 + lVar7));
        if (UVar4 == '\0') break;
      }
      if (*(long *)(lVar2 + lVar7) == 0) {
        return *(long *)((long)ppNVar1 + lVar7) == 0;
      }
    }
  }
  return '\0';
}

Assistant:

UBool
RuleBasedNumberFormat::operator==(const Format& other) const
{
    if (this == &other) {
        return TRUE;
    }

    if (typeid(*this) == typeid(other)) {
        const RuleBasedNumberFormat& rhs = (const RuleBasedNumberFormat&)other;
        // test for capitalization info equality is adequately handled
        // by the NumberFormat test for fCapitalizationContext equality;
        // the info here is just derived from that.
        if (locale == rhs.locale &&
            lenient == rhs.lenient &&
            (localizations == NULL 
                ? rhs.localizations == NULL 
                : (rhs.localizations == NULL 
                    ? FALSE
                    : *localizations == rhs.localizations))) {

            NFRuleSet** p = fRuleSets;
            NFRuleSet** q = rhs.fRuleSets;
            if (p == NULL) {
                return q == NULL;
            } else if (q == NULL) {
                return FALSE;
            }
            while (*p && *q && (**p == **q)) {
                ++p;
                ++q;
            }
            return *q == NULL && *p == NULL;
        }
    }

    return FALSE;
}